

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chillout.cpp
# Opt level: O3

int __thiscall Debug::Chillout::init(Chillout *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  PosixCrashHandler *this_00;
  string *in_RDX;
  
  LOCK();
  iVar1 = (this->m_InitCounter).super___atomic_base<int>._M_i;
  (this->m_InitCounter).super___atomic_base<int>._M_i =
       (this->m_InitCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (iVar1 != 0) {
    return iVar1;
  }
  this_00 = PosixCrashHandler::getInstance();
  PosixCrashHandler::setup(this_00,(string *)ctx,in_RDX);
  return extraout_EAX;
}

Assistant:

void Chillout::init(const string_t &appName, const string_t &pathToDumpsDir) {
        if (0 == m_InitCounter.fetch_add(1)) {
#ifdef _WIN32
            WindowsCrashHandler &handler = WindowsCrashHandler::getInstance();
#else
            PosixCrashHandler &handler = PosixCrashHandler::getInstance();
#endif
            handler.setup(appName, pathToDumpsDir);
        }
    }